

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

Status __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::change(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int idx,
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *subst,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *e)

{
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Status SVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  undefined1 auStack_78 [80];
  
  if (this->usetup == true) {
    if ((this->
        super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).l.updateType != 1) {
      iVar15 = (this->eta).super_IdxSet.num;
      pnVar18 = (this->eta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->eta).setupStatus = false;
      piVar17 = (this->eta).super_IdxSet.idx;
LAB_003dcf8f:
      CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::update(&this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,idx,pnVar18,piVar17,iVar15);
      (this->eta).super_IdxSet.num = 0;
      (this->eta).setupStatus = true;
      goto LAB_003dcfa7;
    }
    iVar15 = (this->forest).super_IdxSet.num;
    pnVar18 = (this->forest).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    piVar17 = (this->forest).super_IdxSet.idx;
  }
  else {
    this_00 = &this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    if (e != (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0) {
      (this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType = 0;
      CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::updateNoClear(this_00,idx,
                      (e->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(e->super_IdxSet).idx,
                      (e->super_IdxSet).num);
      (this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType = this->uptype;
      goto LAB_003dcfa7;
    }
    if ((this->
        super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).l.updateType != 1) {
      pnVar3 = (this->vec).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar13 = (this->vec).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar13 != pnVar3;
          pnVar13 = pnVar13 + 1) {
        (pnVar13->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar13->m_backend).prec_elem = 0x10;
        (pnVar13->m_backend).data._M_elems[0] = 0;
        (pnVar13->m_backend).data._M_elems[1] = 0;
        (pnVar13->m_backend).data._M_elems[2] = 0;
        (pnVar13->m_backend).data._M_elems[3] = 0;
        (pnVar13->m_backend).data._M_elems[4] = 0;
        (pnVar13->m_backend).data._M_elems[5] = 0;
        (pnVar13->m_backend).data._M_elems[6] = 0;
        (pnVar13->m_backend).data._M_elems[7] = 0;
        (pnVar13->m_backend).data._M_elems[8] = 0;
        (pnVar13->m_backend).data._M_elems[9] = 0;
        (pnVar13->m_backend).data._M_elems[10] = 0;
        (pnVar13->m_backend).data._M_elems[0xb] = 0;
        (pnVar13->m_backend).data._M_elems[0xc] = 0;
        (pnVar13->m_backend).data._M_elems[0xd] = 0;
        (pnVar13->m_backend).data._M_elems[0xe] = 0;
        (pnVar13->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar13->m_backend).data._M_elems + 0x3d) = 0;
      }
      if (0 < subst->memused) {
        lVar14 = 0x50;
        lVar16 = 0;
        do {
          pNVar4 = subst->m_elem;
          iVar15 = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14);
          pnVar13 = (this->vec).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar14);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar14);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14 + -0x30);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14 + -0x20);
          uVar11 = puVar1[1];
          puVar2 = pnVar13[iVar15].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = *puVar1;
          *(undefined8 *)(puVar2 + 2) = uVar11;
          puVar2 = pnVar13[iVar15].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = uVar9;
          *(undefined8 *)(puVar2 + 2) = uVar10;
          puVar2 = pnVar13[iVar15].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = uVar7;
          *(undefined8 *)(puVar2 + 2) = uVar8;
          *(undefined8 *)&pnVar13[iVar15].m_backend.data = uVar5;
          *(undefined8 *)(pnVar13[iVar15].m_backend.data._M_elems + 2) = uVar6;
          pnVar13[iVar15].m_backend.exp =
               *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14 + -0x10);
          pnVar13[iVar15].m_backend.neg =
               *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14 + -0xc);
          uVar5 = *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar14 + -8);
          pnVar13[iVar15].m_backend.fpclass = (int)uVar5;
          pnVar13[iVar15].m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 0x54;
        } while (lVar16 < subst->memused);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&this->eta);
      (this->eta).setupStatus = false;
      CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solveRight(this_00,(this->eta).
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                   (this->vec).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      iVar15 = (this->eta).super_IdxSet.num;
      pnVar18 = (this->eta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->eta).setupStatus = false;
      piVar17 = (this->eta).super_IdxSet.idx;
      goto LAB_003dcf8f;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->forest,subst);
    (this->forest).setupStatus = false;
    CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solveLright(this_00,(this->forest).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    (this->forest).setupStatus = false;
    pnVar18 = (this->forest).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar15 = 0;
    piVar17 = (int *)0x0;
  }
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::forestUpdate(&this->
                  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,idx,pnVar18,iVar15,piVar17);
  (this->forest).super_IdxSet.num = 0;
  (this->forest).setupStatus = true;
LAB_003dcfa7:
  this->usetup = false;
  (*(this->
    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SLinSolver[6])(auStack_78,this);
  SVar12 = (*(this->
             super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SLinSolver[1])(this);
  return SVar12;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::change(
   int             idx,
   const SVectorBase<R>&  subst,
   const SSVectorBase<R>* e)
{

   // BH 2005-08-23: The boolean usetup indicates that an "update VectorBase<R>"
   // has been set up. I suppose that SSVectorBase<R>  forest is this
   // update VectorBase<R>, which is set up by solveRight4update() and
   // solve2right4update() in order to optimize the basis update.

   if(usetup)
   {
      if(this->l.updateType == FOREST_TOMLIN)               // FOREST_TOMLIN updates
      {
         // BH 2005-08-19: The size of a SSVectorBase<R>  is the size of the
         // index set, i.e.  the number of nonzeros which is only
         // defined if the SSVectorBase<R>  is set up.  Since
         // SSVectorBase<R> ::altValues() calls unSetup() the size needs to be
         // stored before the following call.
         int fsize = forest.size(); // see altValues()
         this->forestUpdate(idx, forest.altValues(), fsize, forest.altIndexMem());
         forest.setSize(0);
         forest.forceSetup();
      }
      else
      {
         assert(this->l.updateType == ETA);
         changeEta(idx, eta);
      }
   }
   else if(e != nullptr)                                    // ETA updates
   {
      this->l.updateType = ETA;
      this->updateNoClear(idx, e->values(), e->indexMem(), e->size());
      this->l.updateType = uptype;
   }
   else if(this->l.updateType == FOREST_TOMLIN)             // FOREST_TOMLIN updates
   {
      assert(0);  // probably this part is never called.
      // forestUpdate() with the last parameter set to NULL should fail.
      forest = subst;
      CLUFactor<R>::solveLright(forest.altValues());
      this->forestUpdate(idx, forest.altValues(), 0, nullptr);
      forest.setSize(0);
      forest.forceSetup();
   }
   else                                               // ETA updates
   {
      assert(this->l.updateType == ETA);
      vec = subst;
      eta.clear();
      CLUFactor<R>::solveRight(eta.altValues(), vec.get_ptr());
      changeEta(idx, eta);
   }

   usetup = false;

   SPxOut::debug(this, "DSLUFA01\tupdated\t\tstability = {}\n", stability());

   return status();
}